

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O2

bool __thiscall ThreadPool::empty(ThreadPool *this)

{
  _List_node_base *p_Var1;
  
  std::mutex::lock(&this->_taskInfo);
  p_Var1 = (this->_task).
           super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
  return p_Var1 == (_List_node_base *)&this->_task;
}

Assistant:

bool ThreadPool::empty()
{
    _taskInfo.lock();

    const bool emp = _task.empty();

    _taskInfo.unlock();

    return emp;
}